

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_histogram.cpp
# Opt level: O2

Histogram *
Omega_h::get_histogram
          (Histogram *__return_storage_ptr__,Mesh *mesh,Int dim,Int nbins,Real min_value,
          Real max_value,Reals *values)

{
  Alloc *pAVar1;
  LO LVar2;
  promoted_t<signed_char> pVar3;
  pointer psVar4;
  Write<double> *this;
  size_t sVar5;
  Read<double> owned_values;
  Write<signed_char> local_118;
  Histogram *local_100;
  vector<long,_std::allocator<long>_> *local_f8;
  pointer local_f0;
  Mesh *local_e8;
  pointer local_e0;
  pointer local_d8;
  undefined1 local_d0 [16];
  Bytes marked;
  Bytes floor_marks;
  Write<double> local_a0;
  Write<double> local_90;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<double> local_50;
  Write<double> local_40;
  
  pAVar1 = (values->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar5 = pAVar1->size;
  }
  else {
    sVar5 = (ulong)pAVar1 >> 3;
  }
  local_100 = __return_storage_ptr__;
  LVar2 = Mesh::nents(mesh,dim);
  if (LVar2 == (int)(sVar5 >> 3)) {
    Write<double>::Write(&local_40,&values->write_);
    Mesh::owned_array<double>
              ((Mesh *)&owned_values,(Int)mesh,(Read<double> *)(ulong)(uint)dim,(Int)&local_40);
    local_e8 = mesh;
    Write<double>::~Write(&local_40);
    local_f8 = &local_100->bins;
    (local_100->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_100->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_100->bins).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_100->min = min_value;
    local_100->max = max_value;
    std::vector<long,_std::allocator<long>_>::resize(local_f8,(long)nbins);
    local_f0 = (pointer)((max_value - min_value) / (double)nbins);
    local_e0 = (pointer)(ulong)(nbins - 1);
    psVar4 = (pointer)0x0;
    local_d8 = (pointer)(ulong)(uint)nbins;
    if (nbins < 1) {
      local_d8 = psVar4;
    }
    for (; local_d8 != psVar4;
        psVar4 = (pointer)((long)&(psVar4->
                                  super___shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 1)) {
      Write<double>::Write(&local_90,&owned_values.write_);
      each_geq_to<double>((Omega_h *)&floor_marks,(Read<double> *)&local_90,
                          (double)(int)psVar4 * (double)local_f0 + min_value);
      Write<double>::~Write(&local_90);
      local_118.shared_alloc_.alloc = (Alloc *)0x0;
      local_118.shared_alloc_.direct_ptr = (void *)0x0;
      if (psVar4 == local_e0) {
        this = &local_50;
        Write<double>::Write(this,&owned_values.write_);
        each_leq_to<double>((Omega_h *)&marked,(Read<double> *)this,max_value);
        Write<signed_char>::operator=(&local_118,(Write<signed_char> *)&marked);
        Write<signed_char>::~Write((Write<signed_char> *)&marked);
      }
      else {
        Write<double>::Write(&local_a0,&owned_values.write_);
        each_lt<double>((Omega_h *)&marked,(Read<double> *)&local_a0,
                        (double)((int)psVar4 + 1) * (double)local_f0 + min_value);
        Write<signed_char>::operator=(&local_118,(Write<signed_char> *)&marked);
        Write<signed_char>::~Write((Write<signed_char> *)&marked);
        this = &local_a0;
      }
      Write<double>::~Write(this);
      Write<signed_char>::Write(&local_60,&floor_marks.write_);
      Write<signed_char>::Write(&local_70,&local_118);
      land_each((Omega_h *)&marked,(Bytes *)&local_60,(Bytes *)&local_70);
      Write<signed_char>::~Write(&local_70);
      Write<signed_char>::~Write(&local_60);
      Mesh::comm((Mesh *)local_d0);
      Write<signed_char>::Write(&local_80,(Write<signed_char> *)&marked);
      pVar3 = get_sum<signed_char>((CommPtr *)local_d0,(Read<signed_char> *)&local_80);
      (local_f8->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start[(long)psVar4] = (long)pVar3;
      Write<signed_char>::~Write(&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
      Write<signed_char>::~Write((Write<signed_char> *)&marked);
      Write<signed_char>::~Write(&local_118);
      Write<signed_char>::~Write(&floor_marks.write_);
    }
    Write<double>::~Write(&owned_values.write_);
    return local_100;
  }
  fail("assertion %s failed at %s +%d\n","values.size() == mesh->nents(dim)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_histogram.cpp"
       ,0x11);
}

Assistant:

Histogram get_histogram(Mesh* mesh, Int dim, Int nbins, Real min_value,
    Real max_value, Reals values) {
  OMEGA_H_CHECK(values.size() == mesh->nents(dim));
  auto owned_values = mesh->owned_array(dim, values, 1);
  auto interval = (max_value - min_value) / Real(nbins);
  Histogram histogram;
  histogram.min = min_value;
  histogram.max = max_value;
  histogram.bins.resize(std::size_t(nbins));
  for (Int i = 0; i < nbins; ++i) {
    auto floor = interval * i + min_value;
    auto ceil = interval * (i + 1) + min_value;
    if (i == nbins - 1) ceil = max_value;
    auto floor_marks = each_geq_to(owned_values, floor);
    Read<I8> ceil_marks;
    if (i == nbins - 1)
      ceil_marks = each_leq_to(owned_values, ceil);
    else
      ceil_marks = each_lt(owned_values, ceil);
    auto marked = land_each(floor_marks, ceil_marks);
    histogram.bins[std::size_t(i)] = get_sum(mesh->comm(), marked);
  }
  return histogram;
}